

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decorator.hpp
# Opt level: O0

void __thiscall boost::unit_test::decorator::fixture_t::~fixture_t(fixture_t *this)

{
  base *in_RDI;
  
  in_RDI->_vptr_base = (_func_int **)&PTR_apply_00301578;
  shared_ptr<boost::unit_test::test_unit_fixture>::~shared_ptr
            ((shared_ptr<boost::unit_test::test_unit_fixture> *)0x24844a);
  decorator::base::~base(in_RDI);
  return;
}

Assistant:

class BOOST_TEST_DECL fixture_t : public decorator::base {
public:
    // Constructor
    explicit                fixture_t( test_unit_fixture_ptr impl ) : m_impl( impl ) {}

private:
    // decorator::base interface
    virtual void            apply( test_unit& tu );
    virtual base_ptr        clone() const { return base_ptr(new fixture_t( m_impl )); }

    // Data members
    test_unit_fixture_ptr m_impl;
}